

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.cpp
# Opt level: O0

ssize_t __thiscall VCXProjectWriter::write(VCXProjectWriter *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  bool bVar2;
  XmlOutput *this_00;
  XmlOutput *s;
  undefined4 in_register_00000034;
  xml_output *name;
  long in_FS_OFFSET;
  QString condition;
  QList<QString> *in_stack_fffffffffffffb98;
  xml_output *in_stack_fffffffffffffba0;
  QString *in_stack_fffffffffffffba8;
  char *in_stack_fffffffffffffbb0;
  xml_output *in_stack_fffffffffffffbb8;
  XmlOutput *in_stack_fffffffffffffbc0;
  VCConfiguration *in_stack_fffffffffffffbc8;
  xml_output *commands;
  XmlOutput *in_stack_fffffffffffffbd8;
  xml_output *in_stack_fffffffffffffbe8;
  XmlOutput *in_stack_fffffffffffffbf0;
  
  name = (xml_output *)CONCAT44(in_register_00000034,__fd);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  generateCondition(in_stack_fffffffffffffbc8);
  bVar2 = QList<QString>::isEmpty((QList<QString> *)0x248192);
  if (!bVar2) {
    in_stack_fffffffffffffbe8 = name;
    QString::QString(in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffbd8);
    tag((QString *)in_stack_fffffffffffffbb8);
    in_stack_fffffffffffffbf0 =
         XmlOutput::operator<<(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    QString::QString(in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffbd8);
    attrTag(in_stack_fffffffffffffba8,(QString *)in_stack_fffffffffffffba0);
    XmlOutput::operator<<(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    QString::QString(in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffbd8);
    valueTagDefX((QStringList *)in_stack_fffffffffffffbc0,(QString *)in_stack_fffffffffffffbb8,
                 in_stack_fffffffffffffbb0);
    XmlOutput::operator<<(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    XmlOutput::xml_output::~xml_output(in_stack_fffffffffffffba0);
    QString::~QString((QString *)0x24829b);
    XmlOutput::xml_output::~xml_output(in_stack_fffffffffffffba0);
    QString::~QString((QString *)0x2482b5);
    XmlOutput::xml_output::~xml_output(in_stack_fffffffffffffba0);
    QString::~QString((QString *)0x2482cf);
  }
  bVar2 = QList<QString>::isEmpty((QList<QString> *)0x2482dd);
  if (!bVar2) {
    commands = name;
    QString::QString(in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffbd8);
    tag((QString *)in_stack_fffffffffffffbb8);
    in_stack_fffffffffffffbd8 =
         XmlOutput::operator<<(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    QString::QString(in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffbd8);
    attrTag(in_stack_fffffffffffffba8,(QString *)in_stack_fffffffffffffba0);
    XmlOutput::operator<<(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    QList<QString>::QList((QList<QString> *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
    commandLinesForOutput((QStringList *)commands);
    valueTag((QString *)in_stack_fffffffffffffbb8);
    XmlOutput::operator<<(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    XmlOutput::xml_output::~xml_output(in_stack_fffffffffffffba0);
    QString::~QString((QString *)0x2483e3);
    QList<QString>::~QList((QList<QString> *)0x2483f0);
    XmlOutput::xml_output::~xml_output(in_stack_fffffffffffffba0);
    QString::~QString((QString *)0x24840a);
    XmlOutput::xml_output::~xml_output(in_stack_fffffffffffffba0);
    QString::~QString((QString *)0x248424);
  }
  bVar2 = QString::isEmpty((QString *)0x248432);
  if (!bVar2) {
    QString::QString(in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffbd8);
    tag((QString *)name);
    in_stack_fffffffffffffbc0 =
         XmlOutput::operator<<(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    QString::QString(in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffbd8);
    attrTag(in_stack_fffffffffffffba8,(QString *)in_stack_fffffffffffffba0);
    XmlOutput::operator<<(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    valueTag((QString *)name);
    XmlOutput::operator<<(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    XmlOutput::xml_output::~xml_output(in_stack_fffffffffffffba0);
    XmlOutput::xml_output::~xml_output(in_stack_fffffffffffffba0);
    QString::~QString((QString *)0x24851b);
    XmlOutput::xml_output::~xml_output(in_stack_fffffffffffffba0);
    QString::~QString((QString *)0x248535);
    in_stack_fffffffffffffbb8 = name;
  }
  bVar2 = QList<QString>::isEmpty((QList<QString> *)0x248543);
  if (!bVar2) {
    QString::QString(in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffbd8);
    tag((QString *)in_stack_fffffffffffffbb8);
    this_00 = XmlOutput::operator<<(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    QString::QString(in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffbd8);
    attrTag(in_stack_fffffffffffffba8,(QString *)this_00);
    s = XmlOutput::operator<<(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    QString::QString((QString *)((long)__buf + 0x50),(char *)in_stack_fffffffffffffbd8);
    valueTagDefX((QStringList *)in_stack_fffffffffffffbc0,(QString *)in_stack_fffffffffffffbb8,
                 (char *)s);
    XmlOutput::operator<<(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    XmlOutput::xml_output::~xml_output((xml_output *)this_00);
    QString::~QString((QString *)0x24864a);
    XmlOutput::xml_output::~xml_output((xml_output *)this_00);
    QString::~QString((QString *)0x248664);
    XmlOutput::xml_output::~xml_output((xml_output *)this_00);
    QString::~QString((QString *)0x24867e);
  }
  QString::~QString((QString *)0x24868b);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void VCXProjectWriter::write(XmlOutput &xml, const VCCustomBuildTool &tool)
{
    const QString condition = generateCondition(*tool.config);

    if ( !tool.AdditionalDependencies.isEmpty() )
    {
        xml << tag("AdditionalInputs")
            << attrTag("Condition", condition)
            << valueTagDefX(tool.AdditionalDependencies, "AdditionalInputs", ";");
    }

    if( !tool.CommandLine.isEmpty() )
    {
        xml << tag("Command")
            << attrTag("Condition", condition)
            << valueTag(commandLinesForOutput(tool.CommandLine));
    }

    if ( !tool.Description.isEmpty() )
    {
        xml << tag("Message")
            << attrTag("Condition", condition)
            << valueTag(tool.Description);
    }

    if ( !tool.Outputs.isEmpty() )
    {
        xml << tag("Outputs")
            << attrTag("Condition", condition)
            << valueTagDefX(tool.Outputs, "Outputs", ";");
    }
}